

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

void __thiscall Fl_Spinner_Type::ideal_size(Fl_Spinner_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  int iVar3;
  double extraout_XMM0_Qa;
  
  pFVar1 = (this->super_Fl_Widget_Type).o;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)((long)&pFVar1[3].callback_ + 4),
             (ulong)*(uint *)&pFVar1[3].user_data_);
  iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar3 = 0xf;
  if (0x14 < *(int *)&pFVar1[3].user_data_ + iVar2) {
    iVar3 = iVar2 + *(int *)&pFVar1[3].user_data_ + -6;
  }
  *h = iVar3;
  iVar3 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  *w = *w - iVar3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6d);
  iVar2 = *w + (int)extraout_XMM0_Qa + -1;
  iVar3 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  iVar2 = *h / 2 + iVar3 + (iVar2 - iVar2 % (int)extraout_XMM0_Qa);
  iVar3 = 0x28;
  if (0x28 < iVar2) {
    iVar3 = iVar2;
  }
  *w = iVar3;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Spinner *myo = (Fl_Spinner *)o;
    fl_font(myo->textfont(), myo->textsize());
    h = fl_height() + myo->textsize() - 6;
    if (h < 15) h = 15;
    w -= Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box()) + h / 2;
    if (w < 40) w = 40	;
  }